

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O0

_Bool xor16_populate(uint64_t *keys,uint32_t size,xor16_t *filter)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ushort uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  uint64_t uVar7;
  void *__s;
  void *__ptr;
  void *__ptr_00;
  size_t sVar8;
  ulong *puVar9;
  long lVar10;
  long lVar11;
  uint64_t *puVar12;
  uint64_t uVar13;
  uint64_t *in_RDX;
  uint in_ESI;
  uint64_t val;
  xor_keyindex_t ki;
  size_t stack_size;
  uint16_t *fingerprints2;
  uint16_t *fingerprints1;
  uint16_t *fingerprints0;
  uint32_t h1_1;
  uint32_t h0_1;
  uint64_t hash_2;
  size_t index_2;
  xor_keyindex_t keyindex_2;
  uint32_t h2_1;
  uint32_t h0;
  uint64_t hash_1;
  size_t index_1;
  xor_keyindex_t keyindex_1;
  uint32_t h2;
  uint32_t h1;
  uint64_t hash;
  size_t index;
  xor_keyindex_t keyindex;
  size_t stack_size_1;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t Q2size;
  size_t Q1size;
  size_t Q0size;
  xor_hashes_t hs;
  uint64_t key;
  size_t i;
  int iterations;
  xor_keyindex_t *Q2;
  xor_keyindex_t *Q1;
  xor_keyindex_t *Q0;
  xor_xorset_t *sets2;
  xor_xorset_t *sets1;
  xor_xorset_t *sets0;
  xor_keyindex_t *stack;
  xor_keyindex_t *Q;
  xor_xorset_t *sets;
  size_t blockLength;
  size_t arrayLength;
  uint64_t rng_counter;
  xor16_t *in_stack_fffffffffffffe18;
  uint64_t in_stack_fffffffffffffe20;
  size_t in_stack_fffffffffffffe28;
  long lVar14;
  undefined4 in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe34;
  xor16_t *in_stack_fffffffffffffe38;
  uint64_t uVar15;
  uint64_t in_stack_fffffffffffffe40;
  ulong local_180;
  undefined8 local_140;
  undefined8 local_118;
  ulong local_e8;
  ulong local_e0;
  ulong local_d8;
  ulong local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  ulong local_90;
  int local_84;
  uint64_t local_28;
  uint64_t *local_20;
  uint local_14;
  _Bool local_1;
  
  if (in_ESI == 0) {
    local_1 = false;
  }
  else {
    local_28 = 1;
    local_20 = in_RDX;
    local_14 = in_ESI;
    uVar7 = xor_rng_splitmix64(&local_28);
    *local_20 = uVar7;
    uVar7 = local_20[1];
    uVar1 = local_20[1];
    __s = malloc(uVar7 * 0x30);
    __ptr = malloc(uVar7 * 0x30);
    __ptr_00 = malloc((ulong)local_14 << 4);
    if (((__s == (void *)0x0) || (__ptr == (void *)0x0)) || (__ptr_00 == (void *)0x0)) {
      free(__s);
      free(__ptr);
      free(__ptr_00);
      local_1 = false;
    }
    else {
      local_84 = 0;
      while( true ) {
        local_84 = local_84 + 1;
        if (local_84 == 10) {
          sVar8 = xor_sort_and_remove_dup
                            ((uint64_t *)
                             CONCAT44(in_stack_fffffffffffffe34,in_stack_fffffffffffffe30),
                             in_stack_fffffffffffffe28);
          local_14 = (uint)sVar8;
        }
        if (100 < local_84) {
          free(__s);
          free(__ptr);
          free(__ptr_00);
          return false;
        }
        memset(__s,0,uVar7 * 0x30);
        for (local_90 = 0; local_90 < local_14; local_90 = local_90 + 1) {
          xor16_get_h0_h1_h2(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
          puVar9 = (ulong *)((long)__s + (ulong)local_a8 * 0x10);
          *puVar9 = local_b0 ^ *puVar9;
          *(int *)((long)__s + (ulong)local_a8 * 0x10 + 8) =
               *(int *)((long)__s + (ulong)local_a8 * 0x10 + 8) + 1;
          puVar9 = (ulong *)((long)__s + (ulong)local_a4 * 0x10 + uVar1 * 0x10);
          *puVar9 = local_b0 ^ *puVar9;
          lVar10 = (ulong)local_a4 * 0x10 + uVar1 * 0x10;
          *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + 1;
          puVar9 = (ulong *)((long)__s + (ulong)local_a0 * 0x10 + uVar1 * 0x20);
          *puVar9 = local_b0 ^ *puVar9;
          lVar10 = (ulong)local_a0 * 0x10 + uVar1 * 0x20;
          *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + 1;
        }
        local_b8 = 0;
        local_c0 = 0;
        local_c8 = 0;
        for (local_d0 = 0; local_d0 < local_20[1]; local_d0 = local_d0 + 1) {
          if (*(int *)((long)__s + local_d0 * 0x10 + 8) == 1) {
            *(int *)((long)__ptr + local_b8 * 0x10 + 8) = (int)local_d0;
            *(undefined8 *)((long)__ptr + local_b8 * 0x10) =
                 *(undefined8 *)((long)__s + local_d0 * 0x10);
            local_b8 = local_b8 + 1;
          }
        }
        for (local_d8 = 0; local_d8 < local_20[1]; local_d8 = local_d8 + 1) {
          if (*(int *)((long)__s + local_d8 * 0x10 + uVar1 * 0x10 + 8) == 1) {
            *(int *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10 + 8) = (int)local_d8;
            *(undefined8 *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10) =
                 *(undefined8 *)((long)__s + local_d8 * 0x10 + uVar1 * 0x10);
            local_c0 = local_c0 + 1;
          }
        }
        for (local_e0 = 0; local_e0 < local_20[1]; local_e0 = local_e0 + 1) {
          if (*(int *)((long)__s + local_e0 * 0x10 + uVar1 * 0x20 + 8) == 1) {
            *(int *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20 + 8) = (int)local_e0;
            *(undefined8 *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20) =
                 *(undefined8 *)((long)__s + local_e0 * 0x10 + uVar1 * 0x20);
            local_c8 = local_c8 + 1;
          }
        }
        local_e8 = 0;
        while (local_b8 + local_c0 + local_c8 != 0) {
          while (local_b8 != 0) {
            local_b8 = local_b8 + -1;
            puVar9 = (ulong *)((long)__ptr + local_b8 * 0x10);
            uVar2 = *puVar9;
            uVar3 = puVar9[1];
            if (*(int *)((long)__s + (uVar3 & 0xffffffff) * 0x10 + 8) != 0) {
              uVar5 = xor16_get_h1(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              uVar6 = xor16_get_h2(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              puVar9 = (ulong *)((long)__ptr_00 + local_e8 * 0x10);
              *puVar9 = uVar2;
              puVar9[1] = uVar3;
              local_e8 = local_e8 + 1;
              puVar9 = (ulong *)((long)__s + (ulong)uVar5 * 0x10 + uVar1 * 0x10);
              *puVar9 = uVar2 ^ *puVar9;
              lVar10 = (ulong)uVar5 * 0x10 + uVar1 * 0x10;
              *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar5 * 0x10 + uVar1 * 0x10 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10 + 8) = uVar5;
                *(undefined8 *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10) =
                     *(undefined8 *)((long)__s + (ulong)uVar5 * 0x10 + uVar1 * 0x10);
                local_c0 = local_c0 + 1;
              }
              puVar9 = (ulong *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20);
              *puVar9 = uVar2 ^ *puVar9;
              lVar10 = (ulong)uVar6 * 0x10 + uVar1 * 0x20;
              *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20 + 8) = uVar6;
                *(undefined8 *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20) =
                     *(undefined8 *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20);
                local_c8 = local_c8 + 1;
              }
            }
          }
          while (local_c0 != 0) {
            local_c0 = local_c0 + -1;
            puVar9 = (ulong *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10);
            uVar2 = *puVar9;
            uVar3 = puVar9[1];
            if (*(int *)((long)__s + (uVar3 & 0xffffffff) * 0x10 + uVar1 * 0x10 + 8) != 0) {
              uVar5 = xor16_get_h0(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              uVar6 = xor16_get_h2(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              local_118._0_4_ = (int)uVar3;
              local_118 = CONCAT44((int)(uVar3 >> 0x20),(int)uVar1 + (int)local_118);
              puVar9 = (ulong *)((long)__ptr_00 + local_e8 * 0x10);
              *puVar9 = uVar2;
              puVar9[1] = local_118;
              local_e8 = local_e8 + 1;
              puVar9 = (ulong *)((long)__s + (ulong)uVar5 * 0x10);
              *puVar9 = uVar2 ^ *puVar9;
              *(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) =
                   *(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_b8 * 0x10 + 8) = uVar5;
                *(undefined8 *)((long)__ptr + local_b8 * 0x10) =
                     *(undefined8 *)((long)__s + (ulong)uVar5 * 0x10);
                local_b8 = local_b8 + 1;
              }
              puVar9 = (ulong *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20);
              *puVar9 = uVar2 ^ *puVar9;
              lVar10 = (ulong)uVar6 * 0x10 + uVar1 * 0x20;
              *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20 + 8) = uVar6;
                *(undefined8 *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20) =
                     *(undefined8 *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x20);
                local_c8 = local_c8 + 1;
              }
            }
          }
          while (local_c8 != 0) {
            local_c8 = local_c8 + -1;
            puVar9 = (ulong *)((long)__ptr + local_c8 * 0x10 + uVar1 * 0x20);
            uVar2 = *puVar9;
            uVar3 = puVar9[1];
            if (*(int *)((long)__s + (uVar3 & 0xffffffff) * 0x10 + uVar1 * 0x20 + 8) != 0) {
              uVar5 = xor16_get_h0(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              uVar6 = xor16_get_h1(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
              local_140._0_4_ = (int)uVar3;
              local_140 = CONCAT44((int)(uVar3 >> 0x20),(int)uVar1 * 2 + (int)local_140);
              puVar9 = (ulong *)((long)__ptr_00 + local_e8 * 0x10);
              *puVar9 = uVar2;
              puVar9[1] = local_140;
              local_e8 = local_e8 + 1;
              puVar9 = (ulong *)((long)__s + (ulong)uVar5 * 0x10);
              *puVar9 = uVar2 ^ *puVar9;
              *(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) =
                   *(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar5 * 0x10 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_b8 * 0x10 + 8) = uVar5;
                *(undefined8 *)((long)__ptr + local_b8 * 0x10) =
                     *(undefined8 *)((long)__s + (ulong)uVar5 * 0x10);
                local_b8 = local_b8 + 1;
              }
              puVar9 = (ulong *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x10);
              *puVar9 = uVar2 ^ *puVar9;
              lVar10 = (ulong)uVar6 * 0x10 + uVar1 * 0x10;
              *(int *)((long)__s + lVar10 + 8) = *(int *)((long)__s + lVar10 + 8) + -1;
              if (*(int *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x10 + 8) == 1) {
                *(uint32_t *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10 + 8) = uVar6;
                *(undefined8 *)((long)__ptr + local_c0 * 0x10 + uVar1 * 0x10) =
                     *(undefined8 *)((long)__s + (ulong)uVar6 * 0x10 + uVar1 * 0x10);
                local_c0 = local_c0 + 1;
              }
            }
          }
        }
        if (local_e8 == local_14) break;
        uVar13 = xor_rng_splitmix64(&local_28);
        *local_20 = uVar13;
      }
      uVar7 = local_20[2];
      lVar10 = local_20[2] + uVar1 * 2;
      lVar11 = local_20[2] + uVar1 * 4;
      local_180 = (ulong)local_14;
      while (local_180 != 0) {
        local_180 = local_180 - 1;
        puVar12 = (uint64_t *)((long)__ptr_00 + local_180 * 0x10);
        uVar2 = puVar12[1];
        uVar13 = xor_fingerprint(*puVar12);
        if ((uVar2 & 0xffffffff) < uVar1) {
          uVar5 = xor16_get_h1(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar4 = *(ushort *)(lVar10 + (ulong)uVar5 * 2);
          uVar5 = xor16_get_h2(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar4 = uVar4 ^ *(ushort *)(lVar11 + (ulong)uVar5 * 2);
        }
        else if ((uVar2 & 0xffffffff) < uVar1 << 1) {
          uVar15 = uVar7;
          uVar5 = xor16_get_h0(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar4 = *(ushort *)(uVar15 + (ulong)uVar5 * 2);
          lVar14 = lVar11;
          uVar5 = xor16_get_h2(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar4 = uVar4 ^ *(ushort *)(lVar14 + (ulong)uVar5 * 2);
        }
        else {
          in_stack_fffffffffffffe20 = uVar7;
          uVar5 = xor16_get_h0(uVar7,in_stack_fffffffffffffe18);
          uVar4 = *(ushort *)(in_stack_fffffffffffffe20 + (ulong)uVar5 * 2);
          lVar14 = lVar10;
          uVar5 = xor16_get_h1(in_stack_fffffffffffffe20,in_stack_fffffffffffffe18);
          uVar4 = uVar4 ^ *(ushort *)(lVar14 + (ulong)uVar5 * 2);
        }
        *(ushort *)(local_20[2] + (uVar2 & 0xffffffff) * 2) = uVar4 ^ (ushort)uVar13;
      }
      free(__s);
      free(__ptr);
      free(__ptr_00);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

static inline bool xor16_populate(uint64_t *keys, uint32_t size, xor16_t *filter) {
  if(size == 0) { return false; }
  uint64_t rng_counter = 1;
  filter->seed = xor_rng_splitmix64(&rng_counter);
  size_t arrayLength = (size_t)(filter->blockLength) * 3; // size of the backing array
  size_t blockLength = (size_t)(filter->blockLength);

  xor_xorset_t *sets =
      (xor_xorset_t *)malloc(arrayLength * sizeof(xor_xorset_t));

  xor_keyindex_t *Q =
      (xor_keyindex_t *)malloc(arrayLength * sizeof(xor_keyindex_t));

  xor_keyindex_t *stack =
      (xor_keyindex_t *)malloc(size * sizeof(xor_keyindex_t));

  if ((sets == NULL) || (Q == NULL) || (stack == NULL)) {
    free(sets);
    free(Q);
    free(stack);
    return false;
  }
  xor_xorset_t *sets0 = sets;
  xor_xorset_t *sets1 = sets + blockLength;
  xor_xorset_t *sets2 = sets + 2 * blockLength;

  xor_keyindex_t *Q0 = Q;
  xor_keyindex_t *Q1 = Q + blockLength;
  xor_keyindex_t *Q2 = Q + 2 * blockLength;

  int iterations = 0;

  while (true) {
    iterations ++;
    if(iterations == XOR_SORT_ITERATIONS) {
      size = (uint32_t)xor_sort_and_remove_dup(keys, size);
    }
    if(iterations > XOR_MAX_ITERATIONS) {
      // The probability of this happening is lower than the
      // the cosmic-ray probability (i.e., a cosmic ray corrupts your system).
      free(sets);
      free(Q);
      free(stack);
      return false;
    }

    memset(sets, 0, sizeof(xor_xorset_t) * arrayLength);
    for (size_t i = 0; i < size; i++) {
      uint64_t key = keys[i];
      xor_hashes_t hs = xor16_get_h0_h1_h2(key, filter);
      sets0[hs.h0].xormask ^= hs.h;
      sets0[hs.h0].count++;
      sets1[hs.h1].xormask ^= hs.h;
      sets1[hs.h1].count++;
      sets2[hs.h2].xormask ^= hs.h;
      sets2[hs.h2].count++;
    }
    // todo: the flush should be sync with the detection that follows
    // scan for values with a count of one
    size_t Q0size = 0, Q1size = 0, Q2size = 0;
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets0[i].count == 1) {
        Q0[Q0size].index = (uint32_t)i;
        Q0[Q0size].hash = sets0[i].xormask;
        Q0size++;
      }
    }

    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets1[i].count == 1) {
        Q1[Q1size].index = (uint32_t)i;
        Q1[Q1size].hash = sets1[i].xormask;
        Q1size++;
      }
    }
    for (size_t i = 0; i < filter->blockLength; i++) {
      if (sets2[i].count == 1) {
        Q2[Q2size].index = (uint32_t)i;
        Q2[Q2size].hash = sets2[i].xormask;
        Q2size++;
      }
    }

    size_t stack_size = 0;
    while (Q0size + Q1size + Q2size > 0) {
      while (Q0size > 0) {
        xor_keyindex_t keyindex = Q0[--Q0size];
        size_t index = keyindex.index;
        if (sets0[index].count == 0)
          continue; // not actually possible after the initial scan.
        //sets0[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h1 = xor16_get_h1(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);

        stack[stack_size] = keyindex;
        stack_size++;
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q1size > 0) {
        xor_keyindex_t keyindex = Q1[--Q1size];
        size_t index = keyindex.index;
        if (sets1[index].count == 0)
          continue;
        //sets1[index].count = 0;
        uint64_t hash = keyindex.hash;
        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h2 = xor16_get_h2(hash, filter);
        keyindex.index += (uint32_t)blockLength;
        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets2[h2].xormask ^= hash;
        sets2[h2].count--;
        if (sets2[h2].count == 1) {
          Q2[Q2size].index = h2;
          Q2[Q2size].hash = sets2[h2].xormask;
          Q2size++;
        }
      }
      while (Q2size > 0) {
        xor_keyindex_t keyindex = Q2[--Q2size];
        size_t index = keyindex.index;
        if (sets2[index].count == 0)
          continue;

        //sets2[index].count = 0;
        uint64_t hash = keyindex.hash;

        uint32_t h0 = xor16_get_h0(hash, filter);
        uint32_t h1 = xor16_get_h1(hash, filter);
        keyindex.index += 2 * (uint32_t)blockLength;

        stack[stack_size] = keyindex;
        stack_size++;
        sets0[h0].xormask ^= hash;
        sets0[h0].count--;
        if (sets0[h0].count == 1) {
          Q0[Q0size].index = h0;
          Q0[Q0size].hash = sets0[h0].xormask;
          Q0size++;
        }
        sets1[h1].xormask ^= hash;
        sets1[h1].count--;
        if (sets1[h1].count == 1) {
          Q1[Q1size].index = h1;
          Q1[Q1size].hash = sets1[h1].xormask;
          Q1size++;
        }

      }
    }
    if (stack_size == size) {
      // success
      break;
    }

    filter->seed = xor_rng_splitmix64(&rng_counter);
  }
  uint16_t * fingerprints0 = filter->fingerprints;
  uint16_t * fingerprints1 = filter->fingerprints + blockLength;
  uint16_t * fingerprints2 = filter->fingerprints + 2 * blockLength;

  size_t stack_size = size;
  while (stack_size > 0) {
    xor_keyindex_t ki = stack[--stack_size];
    uint64_t val = xor_fingerprint(ki.hash);
    if(ki.index < blockLength) {
      val ^= (uint32_t)fingerprints1[xor16_get_h1(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else if(ki.index < 2 * blockLength) {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints2[xor16_get_h2(ki.hash,filter)];
    } else {
      val ^= (uint32_t)fingerprints0[xor16_get_h0(ki.hash,filter)] ^ fingerprints1[xor16_get_h1(ki.hash,filter)];
    }
    filter->fingerprints[ki.index] = (uint16_t)val;
  }

  free(sets);
  free(Q);
  free(stack);
  return true;
}